

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  Status stat;
  int32_t iVar1;
  long lVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  pointer pnVar5;
  pointer pnVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  
  bVar7 = 0;
  stat = ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.stat)->data[i];
  if (this->theRep * stat < 1) {
    test(&local_a0,this,i,stat);
    pnVar5 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = &local_a0;
    pnVar6 = pnVar5 + i;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    pnVar5[i].m_backend.exp = local_a0.m_backend.exp;
    pnVar5[i].m_backend.neg = local_a0.m_backend.neg;
    pnVar5[i].m_backend.fpclass = local_a0.m_backend.fpclass;
    pnVar5[i].m_backend.prec_elem = local_a0.m_backend.prec_elem;
    pnVar5 = pnVar5 + i;
    pnVar4 = __return_storage_ptr__;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = local_a0.m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = local_a0.m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_a0.m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_a0.m_backend.prec_elem;
  }
  else {
    pnVar5 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar5[i].m_backend,0);
    pcVar3 = &pnVar5[i].m_backend;
    pnVar4 = __return_storage_ptr__;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = (pcVar3->data)._M_elems[0];
      pcVar3 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar3 + (ulong)bVar7 * -8 + 4);
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = pnVar5[i].m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = pnVar5[i].m_backend.neg;
    iVar1 = pnVar5[i].m_backend.prec_elem;
    (__return_storage_ptr__->m_backend).fpclass = pnVar5[i].m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}